

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall
CGL::RaytracedRenderer::save_sampling_rate_image(RaytracedRenderer *this,string *filename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  reference pvVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint *puVar10;
  ulong in_RSI;
  long in_RDI;
  undefined8 uVar11;
  undefined8 uVar12;
  Color CVar13;
  Color CVar14;
  uint32_t out_color_hex;
  size_t i;
  uint32_t *frame_out;
  float r_1;
  float r;
  Color c;
  float samplingRate;
  int y;
  int x;
  ImageBuffer outputBuffer;
  size_t h;
  size_t w;
  char *in_stack_fffffffffffffd50;
  Color *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  float fVar15;
  size_t in_stack_fffffffffffffd68;
  ImageBuffer *in_stack_fffffffffffffd70;
  Color *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  float in_stack_fffffffffffffd84;
  float in_stack_fffffffffffffd88;
  float in_stack_fffffffffffffd8c;
  uint in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uchar *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  float in_stack_fffffffffffffda4;
  float local_1d4;
  string local_1c0 [32];
  string local_1a0 [36];
  undefined4 local_17c;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  Color local_168;
  undefined8 local_158;
  float local_150;
  Color local_144;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  Color local_114;
  undefined8 local_108;
  float local_100;
  Color local_f8;
  float local_ec;
  Color local_e8;
  undefined8 local_d8;
  float local_d0;
  Color local_c4;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  Color local_94;
  undefined8 local_88;
  float local_80;
  Color local_7c;
  float local_70;
  Color local_60;
  float local_54;
  int local_50;
  int local_4c;
  ulong local_20;
  ulong local_18;
  
  local_18 = *(ulong *)(in_RDI + 0xe0);
  local_20 = *(ulong *)(in_RDI + 0xe8);
  ImageBuffer::ImageBuffer
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  CVar14.b = in_stack_fffffffffffffd64;
  CVar14.r = (float)(int)in_stack_fffffffffffffd68;
  CVar14.g = (float)(int)(in_stack_fffffffffffffd68 >> 0x20);
  for (local_4c = 0; (ulong)(long)local_4c < local_18; local_4c = local_4c + 1) {
    for (local_50 = 0; (ulong)(long)local_50 < local_20; local_50 = local_50 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 0x30) + 0xd8),
                          (long)local_50 * local_18 + (long)local_4c);
      local_1d4 = (float)*(ulong *)(*(long *)(in_RDI + 0x30) + 0x40);
      local_54 = (float)*pvVar8 / local_1d4;
      Color::Color(&local_60,0.0,0.0,0.0);
      if (0.5 < local_54) {
        local_ec = (1.0 - local_54) + (1.0 - local_54);
        Color::Color(&local_114,0.0,1.0,0.0);
        uVar11 = 0;
        CVar13 = Color::operator*((Color *)CONCAT44(CVar14.b,in_stack_fffffffffffffd60),
                                  (float)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        fVar15 = CVar14.b;
        in_stack_fffffffffffffda4 = CVar13.b;
        auVar4._8_8_ = uVar11;
        auVar4._0_8_ = CVar13._0_8_;
        local_128 = vmovlpd_avx(auVar4);
        local_120 = in_stack_fffffffffffffda4;
        local_108 = local_128;
        local_100 = in_stack_fffffffffffffda4;
        Color::Color(&local_144,1.0,0.0,0.0);
        uVar11 = 0;
        CVar14 = Color::operator*((Color *)CONCAT44(fVar15,in_stack_fffffffffffffd60),
                                  (float)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        in_stack_fffffffffffffd84 = CVar14.b;
        in_stack_fffffffffffffd88 = CVar14.r;
        in_stack_fffffffffffffd8c = CVar14.g;
        in_stack_fffffffffffffd90 = (uint)uVar11;
        in_stack_fffffffffffffd94 = (uint)((ulong)uVar11 >> 0x20);
        in_stack_fffffffffffffd70 = (ImageBuffer *)0x0;
        auVar3._8_4_ = in_stack_fffffffffffffd90;
        auVar3._0_8_ = CVar14._0_8_;
        auVar3._12_4_ = in_stack_fffffffffffffd94;
        local_158 = vmovlpd_avx(auVar3);
        local_150 = in_stack_fffffffffffffd84;
        local_138 = local_158;
        local_130 = in_stack_fffffffffffffd84;
        CVar14 = Color::operator+((Color *)CONCAT44(fVar15,in_stack_fffffffffffffd60),
                                  in_stack_fffffffffffffd58);
        local_168.b = CVar14.b;
        auVar2._8_8_ = in_stack_fffffffffffffd70;
        auVar2._0_8_ = CVar14._0_8_;
        local_168._0_8_ = vmovlpd_avx(auVar2);
        local_f8._0_8_ = local_168._0_8_;
        local_f8.b = local_168.b;
        local_60._0_8_ = local_168._0_8_;
        local_60.b = local_168.b;
      }
      else {
        local_70 = (0.5 - local_54) + (0.5 - local_54);
        Color::Color(&local_94,0.0,0.0,1.0);
        uVar11 = 0;
        CVar13 = Color::operator*((Color *)CONCAT44(CVar14.b,in_stack_fffffffffffffd60),
                                  (float)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        local_a0 = CVar13.b;
        auVar7._8_8_ = uVar11;
        auVar7._0_8_ = CVar13._0_8_;
        local_a8 = vmovlpd_avx(auVar7);
        local_88 = local_a8;
        local_80 = local_a0;
        Color::Color(&local_c4,0.0,1.0,0.0);
        uVar11 = 0;
        CVar13 = Color::operator*((Color *)CONCAT44(CVar14.b,in_stack_fffffffffffffd60),
                                  (float)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        local_d0 = CVar13.b;
        uVar12 = 0;
        auVar6._8_8_ = uVar11;
        auVar6._0_8_ = CVar13._0_8_;
        local_d8 = vmovlpd_avx(auVar6);
        local_b8 = local_d8;
        local_b0 = local_d0;
        CVar13 = Color::operator+((Color *)CONCAT44(CVar14.b,in_stack_fffffffffffffd60),
                                  in_stack_fffffffffffffd58);
        local_e8.b = CVar13.b;
        auVar5._8_8_ = uVar12;
        auVar5._0_8_ = CVar13._0_8_;
        local_e8._0_8_ = vmovlpd_avx(auVar5);
        local_7c._0_8_ = local_e8._0_8_;
        local_7c.b = local_e8.b;
        local_60._0_8_ = local_e8._0_8_;
        local_60.b = local_e8.b;
      }
      ImageBuffer::update_pixel
                ((ImageBuffer *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70,CVar14._0_8_);
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_18 * local_20;
  uVar9 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new__(uVar9)
  ;
  local_170 = __lhs;
  for (local_178 = 0; local_178 < local_18 * local_20; local_178 = local_178 + 1) {
    local_17c = 0;
    puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1541fd);
    *(uint *)(&local_170->_M_dataplus + local_178 * 4) = puVar10[local_178];
    *(uint *)(&local_170->_M_dataplus + local_178 * 4) =
         *(uint *)(&local_170->_M_dataplus + local_178 * 4) | 0xff000000;
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_1c0,in_RSI);
  std::operator+(__lhs,in_stack_fffffffffffffd50);
  lodepng::encode((string *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                  in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
                  (LodePNGColorType)in_stack_fffffffffffffd8c,(uint)in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_170);
  }
  ImageBuffer::~ImageBuffer((ImageBuffer *)0x154312);
  return;
}

Assistant:

void RaytracedRenderer::save_sampling_rate_image(string filename) {
  size_t w = frameBuffer.w;
  size_t h = frameBuffer.h;
  ImageBuffer outputBuffer(w, h);

  for (int x = 0; x < w; x++) {
      for (int y = 0; y < h; y++) {
          float samplingRate = pt->sampleCountBuffer[y * w + x] * 1.0f / pt->ns_aa;

          Color c;
          if (samplingRate <= 0.5) {
              float r = (0.5 - samplingRate) / 0.5;
              c = Color(0.0f, 0.0f, 1.0f) * r + Color(0.0f, 1.0f, 0.0f) * (1.0 - r);
          } else {
              float r = (1.0 - samplingRate) / 0.5;
              c = Color(0.0f, 1.0f, 0.0f) * r + Color(1.0f, 0.0f, 0.0f) * (1.0 - r);
          }
          outputBuffer.update_pixel(c, x, h - 1 - y);
      }
  }
  uint32_t* frame_out = new uint32_t[w * h];
  
  for (size_t i = 0; i < w * h; ++i) {
    uint32_t out_color_hex = 0;
    frame_out[i] = outputBuffer.data.data()[i];
    frame_out[i] |= 0xFF000000;
  }

  lodepng::encode(filename.substr(0,filename.size()-4) + "_rate.png", (unsigned char*) frame_out, w, h);
  
  delete[] frame_out;
}